

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::addCenterOfMassProjectionConstraint
          (InverseKinematics *this,string *firstSupportFrame,Polygon *firstSupportPolygon,
          string *secondSupportFrame,Polygon *secondSupportPolygon,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::addCenterOfMassProjectionConstraint(const std::string &firstSupportFrame,
                                                                const Polygon &firstSupportPolygon,
                                                                const std::string &secondSupportFrame,
                                                                const Polygon &secondSupportPolygon,
                                                                const iDynTree::Direction xAxisOfPlaneInWorld,
                                                                const iDynTree::Direction yAxisOfPlaneInWorld,
                                                                const iDynTree::Position originOfPlaneInWorld)
    {
#ifdef IDYNTREE_USES_IPOPT
        std::vector<std::string> supportFrames;
        std::vector<Polygon> supportPolygons;
        supportFrames.push_back(firstSupportFrame);
        supportFrames.push_back(secondSupportFrame);
        supportPolygons.push_back(firstSupportPolygon);
        supportPolygons.push_back(secondSupportPolygon);
        return addCenterOfMassProjectionConstraint(supportFrames,supportPolygons,xAxisOfPlaneInWorld,yAxisOfPlaneInWorld,originOfPlaneInWorld);
#else
        return missingIpoptErrorReport();
#endif
    }